

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_context.cpp
# Opt level: O2

void __thiscall
Clasp::SharedContext::simplify(SharedContext *this,size_type trailStart,bool shuffle)

{
  ConstraintDB *db;
  Literal p;
  uint uVar1;
  uint uVar2;
  Solver *pSVar3;
  Constraint *pCVar4;
  Solver *pSVar5;
  pointer ppCVar6;
  int iVar7;
  difference_type dVar8;
  Constraint **first;
  Share SVar9;
  uint32 uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  
  SVar9 = this->share_;
  if ((SVar9._3_1_ >> 1 & ((uint)SVar9 & 0x3fe) != 0) == 0) {
    pSVar3 = *(this->solvers_).ebo_.buf;
    uVar11 = (pSVar3->assign_).trail.ebo_.size;
    if (trailStart < uVar11) {
      for (; trailStart != uVar11; trailStart = trailStart + 1) {
        p.rep_ = (pSVar3->assign_).trail.ebo_.buf[trailStart].rep_;
        if (p.rep_ >> 1 < (this->btig_).graph_.ebo_.size) {
          ShortImplicationsGraph::removeTrue(&this->btig_,*(this->solvers_).ebo_.buf,p);
          uVar11 = (pSVar3->assign_).trail.ebo_.size;
        }
      }
      SVar9 = this->share_;
    }
  }
  pSVar3 = *(this->solvers_).ebo_.buf;
  db = &pSVar3->constraints_;
  if ((((uint)SVar9 & 0x3ff) == 1) || (pSVar3->dbIdx_ == 0)) {
    simplifyDB<bk_lib::pod_vector<Clasp::Constraint*,std::allocator<Clasp::Constraint*>>>
              (pSVar3,db,shuffle);
  }
  else {
    uVar11 = (pSVar3->constraints_).ebo_.size;
    iVar13 = 0;
    for (uVar12 = 0; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      pCVar4 = (db->ebo_).buf[uVar12];
      iVar7 = (*pCVar4->_vptr_Constraint[4])(pCVar4,*(this->solvers_).ebo_.buf,(ulong)shuffle);
      if ((char)iVar7 != '\0') {
        (*pCVar4->_vptr_Constraint[5])(pCVar4,*(this->solvers_).ebo_.buf,0);
        (db->ebo_).buf[uVar12] = (Constraint *)0x0;
        iVar13 = iVar13 + 1;
      }
    }
    if (iVar13 != 0) {
      for (uVar11 = 1; uVar11 != (this->solvers_).ebo_.size; uVar11 = uVar11 + 1) {
        pSVar5 = (this->solvers_).ebo_.buf[uVar11];
        uVar1 = pSVar5->dbIdx_;
        uVar2 = (pSVar3->constraints_).ebo_.size;
        if (uVar2 < uVar1) {
          Potassco::fail(-1,"void Clasp::SharedContext::simplify(LitVec::size_type, bool)",0x47a,
                         "x.dbIdx_ <= db.size()","Invalid DB idx!",0);
        }
        if (uVar1 == uVar2) {
          uVar10 = uVar1 - iVar13;
LAB_0015bd9a:
          pSVar5->dbIdx_ = uVar10;
        }
        else if ((ulong)uVar1 != 0) {
          ppCVar6 = (db->ebo_).buf;
          dVar8 = std::__count_if<Clasp::Constraint**,__gnu_cxx::__ops::_Iter_pred<Clasp::IsNull>>
                            (ppCVar6,ppCVar6 + uVar1);
          uVar10 = pSVar5->dbIdx_ - (int)dVar8;
          goto LAB_0015bd9a;
        }
      }
      ppCVar6 = (pSVar3->constraints_).ebo_.buf;
      first = std::__remove_if<Clasp::Constraint**,__gnu_cxx::__ops::_Iter_pred<Clasp::IsNull>>
                        (ppCVar6,ppCVar6 + (pSVar3->constraints_).ebo_.size);
      bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::erase
                (db,first,(pSVar3->constraints_).ebo_.buf + (pSVar3->constraints_).ebo_.size);
    }
  }
  (*(this->solvers_).ebo_.buf)->dbIdx_ = (pSVar3->constraints_).ebo_.size;
  return;
}

Assistant:

void SharedContext::simplify(LitVec::size_type trailStart, bool shuffle) {
	if (!isShared() && trailStart < master()->trail().size()) {
		for (const LitVec& trail = master()->trail(); trailStart != trail.size(); ++trailStart) {
			Literal p = trail[trailStart];
			if (p.id() < btig_.size()) { btig_.removeTrue(*master(), p); }
		}
	}
	Solver::ConstraintDB& db = master()->constraints_;
	if (concurrency() == 1 || master()->dbIdx_ == 0) {
		Clasp::simplifyDB(*master(), db, shuffle);
	}
	else {
		uint32 rem = 0;
		for (Solver::ConstraintDB::size_type i = 0, end = db.size(); i != end; ++i) {
			Constraint* c = db[i];
			if (c->simplify(*master(), shuffle)) { c->destroy(master(), false); db[i] = 0; ++rem; }
		}
		if (rem) {
			for (SolverVec::size_type s = 1; s != solvers_.size(); ++s) {
				Solver& x = *solvers_[s];
				POTASSCO_ASSERT(x.dbIdx_ <= db.size(), "Invalid DB idx!");
				if      (x.dbIdx_ == db.size()) { x.dbIdx_ -= rem; }
				else if (x.dbIdx_ != 0)         { x.dbIdx_ -= (uint32)std::count_if(db.begin(), db.begin()+x.dbIdx_, IsNull()); }
			}
			db.erase(std::remove_if(db.begin(), db.end(), IsNull()), db.end());
		}
	}
	master()->dbIdx_ = sizeVec(db);
}